

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.c
# Opt level: O2

void test_basic(void)

{
  quicly_sent_packet_t *pqVar1;
  size_t sVar2;
  quicly_sent_acked_cb acked;
  long lVar3;
  long lVar4;
  long lVar5;
  long local_78;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_t map;
  
  map.head = (st_quicly_sent_block_t *)0x0;
  map.tail = (st_quicly_sent_block_t *)0x0;
  map.num_packets = 0;
  map.bytes_in_flight = 0;
  map._pending_packet = (quicly_sent_t *)0x0;
  lVar5 = 0;
  for (lVar4 = 0; lVar3 = 1, lVar4 != 10; lVar4 = lVar4 + 1) {
    for (; lVar3 != 6; lVar3 = lVar3 + 1) {
      acked = (quicly_sent_acked_cb)(lVar5 + lVar3);
      quicly_sentmap_prepare(&map,(uint64_t)acked,lVar4,'\0');
      quicly_sentmap_allocate(&map,acked);
      quicly_sentmap_allocate(&map,acked);
      quicly_sentmap_commit(&map,1);
    }
    lVar5 = lVar5 + 5;
  }
  quicly_sentmap_init_iter(&map,&iter);
  local_78 = 0;
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    for (lVar5 = 1; lVar5 != 6; lVar5 = lVar5 + 1) {
      pqVar1 = quicly_sentmap_get(&iter);
      _ok((uint)(local_78 + lVar5 == pqVar1->packet_number),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x47);
      _ok((uint)(pqVar1->sent_at == lVar4),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x48);
      _ok((uint)(pqVar1->ack_epoch == '\0'),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x49);
      _ok((uint)(pqVar1->cc_bytes_in_flight == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x4a);
      quicly_sentmap_skip(&iter);
    }
    local_78 = local_78 + 5;
  }
  pqVar1 = quicly_sentmap_get(&iter);
  _ok((uint)(pqVar1->packet_number == 0xffffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x4e);
  sVar2 = num_blocks(&map);
  _ok((uint)(sVar2 == 10),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x4f);
  quicly_sentmap_init_iter(&map,&iter);
  while (pqVar1 = quicly_sentmap_get(&iter), pqVar1->packet_number < 0xb) {
    quicly_sentmap_skip(&iter);
  }
  pqVar1 = quicly_sentmap_get(&iter);
  if (pqVar1->packet_number != 0xb) {
    __assert_fail("quicly_sentmap_get(&iter)->packet_number == 11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x55,"void test_basic(void)");
  }
  while (pqVar1 = quicly_sentmap_get(&iter), pqVar1->packet_number < 0x29) {
    quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_EXPIRED);
  }
  _ok((uint)(on_acked_callcnt == 0x3c),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x58);
  _ok((uint)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x59);
  quicly_sentmap_init_iter(&map,&iter);
  lVar4 = 0x14;
  while (pqVar1 = quicly_sentmap_get(&iter), pqVar1->packet_number != 0xffffffffffffffff) {
    _ok((uint)(pqVar1->cc_bytes_in_flight != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x5e);
    _ok((uint)(pqVar1->packet_number - 0x29 < 0xffffffffffffffe2),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x5f);
    quicly_sentmap_skip(&iter);
    lVar4 = lVar4 + -1;
  }
  _ok((uint)(lVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x62);
  sVar2 = num_blocks(&map);
  _ok((uint)(sVar2 == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",99)
  ;
  quicly_sentmap_dispose(&map);
  return;
}

Assistant:

static void test_basic(void)
{
    quicly_maxsender_t m;
    quicly_maxsender_sent_t ackargs;

    quicly_maxsender_init(&m, 100);

    /* basic checks */
    ok(!quicly_maxsender_should_send_max(&m, 0, 100, 512));
    ok(quicly_maxsender_should_send_max(&m, 0, 100, 1024));
    ok(!quicly_maxsender_should_send_max(&m, 99, 100, 0));
    ok(quicly_maxsender_should_send_max(&m, 100, 100, 0));

    /* scenario */
    ok(!quicly_maxsender_should_send_max(&m, 24, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 25, 100, 768));
    quicly_maxsender_record(&m, 125, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 49, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 50, 100, 768));
    quicly_maxsender_acked(&m, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 49, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 50, 100, 768));
    quicly_maxsender_record(&m, 150, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 74, 100, 768));
    quicly_maxsender_lost(&m, &ackargs);
    ok(quicly_maxsender_should_send_max(&m, 74, 100, 768));
}